

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

CURLcode cw_out_flush(Curl_easy *data,Curl_cwriter *cw_out,_Bool flush_all)

{
  CURLcode result;
  cw_out_ctx *ctx;
  _Bool flush_all_local;
  Curl_cwriter *cw_out_local;
  Curl_easy *data_local;
  
  if ((*(byte *)&cw_out[1].next >> 1 & 1) == 0) {
    if (((ulong)cw_out[1].next & 1) == 0) {
      data_local._4_4_ =
           cw_out_flush_chain((cw_out_ctx *)cw_out,data,(cw_out_buf **)(cw_out + 1),flush_all);
      if (data_local._4_4_ != CURLE_OK) {
        *(byte *)&cw_out[1].next = *(byte *)&cw_out[1].next & 0xfd | 2;
        cw_out_bufs_free((cw_out_ctx *)cw_out);
      }
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    data_local._4_4_ = CURLE_WRITE_ERROR;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode cw_out_flush(struct Curl_easy *data,
                             struct Curl_cwriter *cw_out,
                             bool flush_all)
{
  struct cw_out_ctx *ctx = (struct cw_out_ctx *)cw_out;
  CURLcode result = CURLE_OK;

  if(ctx->errored)
    return CURLE_WRITE_ERROR;
  if(ctx->paused)
    return CURLE_OK;  /* not doing it */

  result = cw_out_flush_chain(ctx, data, &ctx->buf, flush_all);
  if(result) {
    ctx->errored = TRUE;
    cw_out_bufs_free(ctx);
    return result;
  }
  return result;
}